

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintTo(char32_t c,ostream *os)

{
  ostream *poVar1;
  long lVar2;
  
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>(os,"U+",2);
  lVar2 = *(long *)os;
  *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  poVar1 = os + *(long *)(lVar2 + -0x18);
  if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar2 = *(long *)os;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  return;
}

Assistant:

void PrintTo(char32_t c, ::std::ostream* os) {
  *os << std::hex << "U+" << std::uppercase << std::setfill('0') << std::setw(4)
      << static_cast<uint32_t>(c);
}